

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_refine_free(lysf_ctx *ctx,lysp_refine *ref)

{
  lysp_qname *plVar1;
  lysp_restr *plVar2;
  lysp_ext_instance *plVar3;
  uint64_t c__;
  ulong uVar4;
  lysp_ext_instance *plVar5;
  long lVar6;
  
  lydict_remove(ctx->ctx,ref->nodeid);
  lydict_remove(ctx->ctx,ref->dsc);
  lydict_remove(ctx->ctx,ref->ref);
  lVar6 = 0;
  uVar4 = 0;
  while (plVar1 = ref->iffeatures, plVar1 != (lysp_qname *)0x0) {
    if (*(ulong *)&plVar1[-1].flags <= uVar4) {
      free(&plVar1[-1].flags);
      break;
    }
    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar1->str + lVar6));
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x18;
  }
  lVar6 = 0;
  plVar5 = (lysp_ext_instance *)0x0;
  while (plVar2 = ref->musts, plVar2 != (lysp_restr *)0x0) {
    if (plVar2[-1].exts <= plVar5) {
      free(&plVar2[-1].exts);
      break;
    }
    lysp_restr_free(ctx,(lysp_restr *)((long)&(plVar2->arg).str + lVar6));
    plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
    lVar6 = lVar6 + 0x40;
  }
  lydict_remove(ctx->ctx,ref->presence);
  lVar6 = 0;
  uVar4 = 0;
  do {
    plVar1 = ref->dflts;
    if (plVar1 == (lysp_qname *)0x0) {
LAB_00158d51:
      lVar6 = 0;
      plVar5 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar3 = ref->exts;
        if (plVar3 == (lysp_ext_instance *)0x0) {
          return;
        }
        if (plVar3[-1].exts <= plVar5) break;
        lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar6));
        plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
        lVar6 = lVar6 + 0x70;
      }
      free(&plVar3[-1].exts);
      return;
    }
    if (*(ulong *)&plVar1[-1].flags <= uVar4) {
      free(&plVar1[-1].flags);
      goto LAB_00158d51;
    }
    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar1->str + lVar6));
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

static void
lysp_refine_free(struct lysf_ctx *ctx, struct lysp_refine *ref)
{
    lydict_remove(ctx->ctx, ref->nodeid);
    lydict_remove(ctx->ctx, ref->dsc);
    lydict_remove(ctx->ctx, ref->ref);
    FREE_ARRAY(ctx->ctx, ref->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, ref->musts, lysp_restr_free);
    lydict_remove(ctx->ctx, ref->presence);
    FREE_ARRAY(ctx->ctx, ref->dflts, lysp_qname_free);
    FREE_ARRAY(ctx, ref->exts, lysp_ext_instance_free);
}